

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O2

void __thiscall Vehicle::add_node(Vehicle *this,Point *p,int pos,int *ec)

{
  mapped_type *pmVar1;
  int iVar2;
  const_iterator __position;
  shared_ptr<VehicleState> possible_state;
  __shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> local_50;
  Point *local_40;
  __shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_40 = p;
  std::make_shared<VehicleState,Point*&>((Point **)&local_50);
  std::__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,&local_50);
  validate_states(this,(shared_ptr<VehicleState> *)&local_38,pos,ec);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  if (*ec == 0) {
    iVar2 = pos + 1;
    __position._M_node = (_List_node_base *)&this->nodes;
    do {
      __position._M_node = (__position._M_node)->_M_next;
      iVar2 = iVar2 + -1;
    } while (0 < iVar2);
    std::__cxx11::
    list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::insert
              (&this->nodes,__position,(value_type *)&local_50);
    pmVar1 = std::__detail::
             _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_40->state,&this->solution);
    pmVar1->first = this;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void Vehicle::add_node(Point *p, int pos, int &ec) {

    auto possible_state = std::make_shared<VehicleState>(p);
    validate_states(possible_state, pos, ec);
    if (ec)
        return;

    auto it = nodes.begin();
    auto tmp_pos = pos;
    while (tmp_pos-- > 0)
        ++it;

    nodes.insert(it, possible_state);
    p->state[solution].first = this;
}